

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceUBO::RunIteration
          (BasicResourceUBO *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  int iVar1;
  GLuint GVar2;
  bool bVar3;
  GLuint GVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  reference pvVar12;
  uint *data_00;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  int local_f8;
  int local_f4;
  int i_2;
  GLuint index_1;
  GLuint x;
  GLuint y;
  GLuint z;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  undefined8 local_c0;
  uint local_b8;
  allocator<tcu::Vector<float,_4>_> local_b1;
  GLuint j;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_1;
  GLuint i_1;
  GLuint kBufferSize;
  GLint p;
  GLuint index;
  char name [32];
  uint local_60;
  GLuint i;
  string local_50;
  byte local_29;
  uvec3 *puStack_28;
  bool dispatch_indirect_local;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicResourceUBO *this_local;
  
  local_29 = dispatch_indirect;
  puStack_28 = num_groups;
  num_groups_local = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  gl4cts::(anonymous_namespace)::BasicResourceUBO::GenSource_abi_cxx11_
            (&local_50,this,num_groups_local,puStack_28);
  GVar4 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar4;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar3 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar3) {
    for (local_60 = 0; local_60 < 0xc; local_60 = local_60 + 1) {
      sprintf((char *)&p,"InputBuffer[%u]",(ulong)local_60);
      kBufferSize = glu::CallLogWrapper::glGetUniformBlockIndex
                              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,this->m_program,(GLchar *)&p);
      glu::CallLogWrapper::glUniformBlockBinding
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program,kBufferSize,local_60);
      i_1 = 0;
      glu::CallLogWrapper::glGetActiveUniformBlockiv
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program,kBufferSize,0x90ec,(GLint *)&i_1);
      if (i_1 == 0) {
        anon_unknown_0::Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
        this_local._7_1_ = 0;
        goto LAB_00f59000;
      }
    }
    uVar5 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
    uVar6 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
    uVar7 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
    uVar8 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
    uVar9 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
    uVar10 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
    data_1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         uVar5 * uVar6 * uVar7 * uVar8 * uVar9 * uVar10;
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
    }
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,
               (ulong)data_1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0xc0,(void *)0x0,
               0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    if (this->m_uniform_buffer[0] == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xc,this->m_uniform_buffer);
    }
    for (data_1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)data_1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage < 0xc;
        data_1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)data_1.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      uVar11 = (ulong)data_1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      std::allocator<tcu::Vector<float,_4>_>::allocator(&local_b1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&j,uVar11
                 ,&local_b1);
      std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_b1);
      for (local_b8 = 0;
          local_b8 <
          data_1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_b8 = local_b8 + 1) {
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)
                   &data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (float)((uint)data_1.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage *
                           data_1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + local_b8));
        pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)&j,(ulong)local_b8);
        *(pointer *)pvVar12->m_data =
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)(pvVar12->m_data + 2) = local_c0;
      }
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8a11,
                 (uint)data_1.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 this->m_uniform_buffer
                 [(uint)data_1.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage]);
      uVar11 = (ulong)data_1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&j,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8a11,uVar11 << 4,pvVar12,0x88e8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&j);
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8a11,0);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    if ((local_29 & 1) == 0) {
      uVar5 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar6 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      uVar7 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,uVar5,uVar6,uVar7);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      data_00 = tcu::Vector<unsigned_int,_3>::operator[](puStack_28,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,data_00,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    uVar5 = data_1.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0xc;
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&y + 3));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&z,
               (ulong)uVar5,(allocator<tcu::Vector<float,_4>_> *)((long)&y + 3));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&y + 3));
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    uVar11 = (ulong)data_1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &z,0);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,uVar11 * 0xc0,pvVar12);
    x = 0;
    while( true ) {
      GVar4 = x;
      uVar5 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
      uVar6 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      if (uVar5 * uVar6 <= GVar4) break;
      index_1 = 0;
      while( true ) {
        GVar4 = index_1;
        uVar5 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
        uVar6 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
        if (uVar5 * uVar6 <= GVar4) break;
        i_2 = 0;
        while( true ) {
          iVar1 = i_2;
          uVar5 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
          uVar6 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
          GVar4 = x;
          if (uVar5 * uVar6 <= (uint)iVar1) break;
          uVar5 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
          uVar6 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
          uVar7 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
          uVar8 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
          GVar2 = index_1;
          uVar9 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
          uVar10 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
          local_f4 = GVar4 * uVar5 * uVar6 * uVar7 * uVar8 + GVar2 * uVar9 * uVar10 + i_2;
          for (local_f8 = 0; local_f8 < 1; local_f8 = local_f8 + 1) {
            pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)&z,(ulong)(uint)(local_f8 + local_f4 * 0xc));
            tcu::Vector<float,_4>::Vector(&local_108,pvVar12);
            tcu::Vector<float,_4>::Vector(&local_118,(float)(uint)(local_f8 + local_f4 * 0xc));
            bVar3 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_108,&local_118)
            ;
            if (!bVar3) {
              anon_unknown_0::Output
                        ("Incorrect data at offset %d.\n",(ulong)(uint)(local_f8 + local_f4 * 0xc));
              this_local._7_1_ = 0;
              goto LAB_00f58ff4;
            }
          }
          i_2 = i_2 + 1;
        }
        index_1 = index_1 + 1;
      }
      x = x + 1;
    }
    this_local._7_1_ = 1;
LAB_00f58ff4:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&z);
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00f59000:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		for (GLuint i = 0; i < 12; ++i)
		{
			char name[32];
			sprintf(name, "InputBuffer[%u]", i);
			const GLuint index = glGetUniformBlockIndex(m_program, name);
			glUniformBlockBinding(m_program, index, i);
			GLint p = 0;
			glGetActiveUniformBlockiv(m_program, index, GL_UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER, &p);
			if (p == GL_FALSE)
			{
				Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
				return false;
			}
		}

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 12, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_uniform_buffer[0] == 0)
			glGenBuffers(12, m_uniform_buffer);
		for (GLuint i = 0; i < 12; ++i)
		{
			std::vector<vec4> data(kBufferSize);
			for (GLuint j = 0; j < kBufferSize; ++j)
			{
				data[j] = vec4(static_cast<float>(i * kBufferSize + j));
			}
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		}
		glBindBuffer(GL_UNIFORM_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		std::vector<vec4> data(kBufferSize * 12);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize * 12, &data[0]);

		for (GLuint z = 0; z < local_size.z() * num_groups.z(); ++z)
		{
			for (GLuint y = 0; y < local_size.y() * num_groups.y(); ++y)
			{
				for (GLuint x = 0; x < local_size.x() * num_groups.x(); ++x)
				{
					const GLuint index = z * local_size.x() * num_groups.x() * local_size.y() * num_groups.y() +
										 y * local_size.x() * num_groups.x() + x;
					for (int i = 0; i < 1; ++i)
					{
						if (!IsEqual(data[index * 12 + i], vec4(static_cast<float>(index * 12 + i))))
						{
							Output("Incorrect data at offset %d.\n", index * 12 + i);
							return false;
						}
					}
				}
			}
		}
		return true;
	}